

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::verifyXFBData
          (FunctionalTest1_2 *this,void *xfb_data,_variable_type *variable_type)

{
  bool bVar1;
  _variable_type _Var2;
  uint uVar3;
  MessageBuilder *pMVar4;
  long lVar5;
  uint uVar6;
  _variable_type *variable_type_00;
  _variable_type *variable_type_01;
  _variable_type *variable_type_02;
  _variable_type *variable_type_03;
  uint uVar7;
  int *piVar8;
  bool bVar9;
  float fVar10;
  double dVar11;
  float fVar12;
  double dVar13;
  string local_1d0;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  _Var2 = Utils::getBaseVariableType(variable_type);
  uVar3 = Utils::getNumberOfComponentsForVariableType(variable_type);
  if (_Var2 == VARIABLE_TYPE_BOOL) {
    bVar1 = true;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      piVar8 = (int *)((long)xfb_data + (ulong)(uVar3 << 2));
      uVar6 = uVar3;
      while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
        if (*xfb_data != (&DAT_016a98f0)[lVar5]) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<(&local_1a8,"Invalid value reported by subroutine using [");
          Utils::getVariableTypeGLSLString_abi_cxx11_
                    (&local_1d0,(Utils *)variable_type,variable_type_03);
          std::operator<<(&local_1a8,(string *)&local_1d0);
          std::operator<<(&local_1a8,"]");
          std::operator<<(&local_1a8," argument/return types (expected:[");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::operator<<(&local_1a8,"], found:[");
          pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)xfb_data);
          std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"])");
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          bVar1 = false;
          piVar8 = (int *)xfb_data;
          break;
        }
        xfb_data = (void *)((long)xfb_data + 4);
      }
      xfb_data = piVar8;
    }
  }
  else {
    bVar1 = true;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      uVar6 = (&DAT_016a98f8)[lVar5];
      uVar7 = uVar3;
      while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
        if (_Var2 == VARIABLE_TYPE_UINT) {
LAB_00a12e39:
          if (*xfb_data != uVar6) {
            local_1b0 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::operator<<(&local_1a8,"Invalid value reported by subroutine using [");
            Utils::getVariableTypeGLSLString_abi_cxx11_
                      (&local_1d0,(Utils *)variable_type,variable_type_01);
            std::operator<<(&local_1a8,(string *)&local_1d0);
            std::operator<<(&local_1a8,"]");
            std::operator<<(&local_1a8," argument/return types (expected:[");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::operator<<(&local_1a8,"], found:[");
            pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)xfb_data);
            std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"])"
                           );
            tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a12fe1:
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            bVar1 = false;
          }
LAB_00a12ff5:
          xfb_data = (void *)((long)xfb_data + 4);
        }
        else {
          if (_Var2 == VARIABLE_TYPE_FLOAT) {
            fVar10 = *xfb_data - (float)uVar6;
            fVar12 = -fVar10;
            if (-fVar10 <= fVar10) {
              fVar12 = fVar10;
            }
            if (1e-05 < fVar12) {
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::operator<<(&local_1a8,"Invalid value reported by subroutine using [");
              Utils::getVariableTypeGLSLString_abi_cxx11_
                        (&local_1d0,(Utils *)variable_type,variable_type_02);
              std::operator<<(&local_1a8,(string *)&local_1d0);
              std::operator<<(&local_1a8,"]");
              std::operator<<(&local_1a8," argument/return types (expected:[");
              std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
              std::operator<<(&local_1a8,"], found:[");
              pMVar4 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)local_1b0,(float *)xfb_data);
              std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              "])");
              tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00a12fe1;
            }
            goto LAB_00a12ff5;
          }
          if (_Var2 == VARIABLE_TYPE_INT) goto LAB_00a12e39;
          if (_Var2 == VARIABLE_TYPE_DOUBLE) {
            dVar11 = *xfb_data - (double)uVar6;
            dVar13 = -dVar11;
            if (-dVar11 <= dVar11) {
              dVar13 = dVar11;
            }
            if (9.999999747378752e-06 < dVar13) {
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::operator<<(&local_1a8,"Invalid value reported by subroutine using [");
              Utils::getVariableTypeGLSLString_abi_cxx11_
                        (&local_1d0,(Utils *)variable_type,variable_type_00);
              std::operator<<(&local_1a8,(string *)&local_1d0);
              std::operator<<(&local_1a8,"]");
              std::operator<<(&local_1a8," argument/return types (expected:[");
              std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
              std::operator<<(&local_1a8,"], found:[");
              pMVar4 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)local_1b0,(double *)xfb_data);
              std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              "])");
              tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::string::~string((string *)&local_1d0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              bVar1 = false;
            }
            xfb_data = (void *)((long)xfb_data + 8);
          }
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool FunctionalTest1_2::verifyXFBData(const void* xfb_data, const Utils::_variable_type& variable_type)
{
	const Utils::_variable_type base_variable_type		   = Utils::getBaseVariableType(variable_type);
	const float					epsilon					   = 1e-5f;
	const unsigned int			n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
	bool						result					   = true;
	const unsigned char*		traveller_ptr			   = (const unsigned char*)xfb_data;

	/* Boolean arguments/return types are tested with a slightly different shader so we
	 * need to test them in a separate code-path.
	 */
	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* 0 should be returned when getter0 is used, 1 otherwise */
		const unsigned int ref_values[] = { 0, 1 };
		const unsigned int n_ref_values = sizeof(ref_values) / sizeof(ref_values[0]);

		for (unsigned int n_ref_value = 0; n_ref_value < n_ref_values; ++n_ref_value)
		{
			const unsigned int ref_value = ref_values[n_ref_value];

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				int* result_value_ptr = (int*)(traveller_ptr);

				if (*result_value_ptr != (int)ref_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																   "["
									   << Utils::getVariableTypeGLSLString(variable_type) << "]"
									   << " argument/return types ("
										  "expected:["
									   << ref_value << "], found:[" << *result_value_ptr << "])"
									   << tcu::TestLog::EndMessage;

					result = false;
					break;
				}

				traveller_ptr += sizeof(int);
			} /* for (all components) */
		}	 /* for (all reference values) */
	}		  /* if (base_variable_type == Utils::VARIABLE_TYPE_BOOL) */
	else
	{
		/* 4 should be returned when getter0 is used, 5 otherwise */
		const unsigned int ref_values[] = { 4, 5 };
		const unsigned int n_ref_values = sizeof(ref_values) / sizeof(ref_values[0]);

		for (unsigned int n_ref_value = 0; n_ref_value < n_ref_values; ++n_ref_value)
		{
			const unsigned int ref_value = ref_values[n_ref_value];

			DE_ASSERT(
				base_variable_type == Utils::VARIABLE_TYPE_DOUBLE || base_variable_type == Utils::VARIABLE_TYPE_FLOAT ||
				base_variable_type == Utils::VARIABLE_TYPE_INT || base_variable_type == Utils::VARIABLE_TYPE_UINT);

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				const double* double_value_ptr = (double*)traveller_ptr;
				const float*  float_value_ptr  = (float*)traveller_ptr;
				const int*	int_value_ptr	= (int*)traveller_ptr;

				switch (base_variable_type)
				{
				case Utils::VARIABLE_TYPE_DOUBLE:
				{
					if (de::abs(*double_value_ptr - (double)ref_value) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *double_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(double);
					break;
				}

				case Utils::VARIABLE_TYPE_FLOAT:
				{
					if (de::abs(*float_value_ptr - (float)ref_value) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *float_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(float);
					break;
				}

				case Utils::VARIABLE_TYPE_INT:
				case Utils::VARIABLE_TYPE_UINT:
				{
					if (*int_value_ptr != (int)ref_value)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *int_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(int);
					break;
				}

				default:
					break;
				} /* switch (base_variable_type) */
			}	 /* for (all components) */
		}		  /* for (all reference values) */
	}

	return result;
}